

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

void __thiscall
cppgenerate::Class::printConstructors
          (Class *this,ostream *stream,AccessModifier modifier,bool signatureOnly)

{
  pointer pCVar1;
  AccessModifier AVar2;
  ostream *poVar3;
  pointer other;
  bool bVar4;
  string accessString;
  Constructor constructor;
  char *local_210;
  long local_208;
  char local_200 [16];
  undefined1 local_1f0 [448];
  
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = '\0';
  if (modifier < (PROTECTED|PRIVATE)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_210,0,(char *)0x0,(ulong)(&PTR_anon_var_dwarf_7ec6_00119d28)[modifier])
    ;
  }
  other = (this->m_constructors).
          super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>.
          _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_constructors).
           super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (other != pCVar1) {
    bVar4 = false;
    do {
      Constructor::Constructor((Constructor *)local_1f0,other);
      AVar2 = Constructor::accessModifier((Constructor *)local_1f0);
      if (AVar2 == modifier) {
        if (!bVar4) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(stream,local_210,local_208);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        if (signatureOnly) {
          bVar4 = true;
          Constructor::printSignature((Constructor *)local_1f0,this,stream,false);
        }
        else {
          bVar4 = true;
          Constructor::printImplementation((Constructor *)local_1f0,this,stream,true);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f0 + 0x38));
      std::ios_base::~ios_base((ios_base *)(local_1f0 + 0xa8));
      std::__cxx11::_List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::
      _M_clear((_List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_> *)
               (local_1f0 + 0x20));
      if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
        operator_delete((void *)local_1f0._0_8_);
      }
      other = other + 1;
    } while (other != pCVar1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  return;
}

Assistant:

void Class::printConstructors( std::ostream& stream, AccessModifier modifier, bool signatureOnly ) const{
    bool havePrinted = false;
    std::string accessString;

    switch( modifier ){
    case cppgenerate::AccessModifier::PRIVATE: accessString = "private:"; break;
    case cppgenerate::AccessModifier::PUBLIC: accessString = "public:"; break;
    case cppgenerate::AccessModifier::PROTECTED: accessString = "protected:"; break;
    }

    for( cppgenerate::Constructor constructor : m_constructors ){
        if( constructor.accessModifier() != modifier ) continue;
        if( !havePrinted ){
            stream << accessString << std::endl;
            havePrinted = true;
        }
        if( signatureOnly ){
            constructor.printSignature( this, stream, false );
        }else{
            constructor.printImplementation( this, stream, true );
        }
    }
}